

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::ModportSymbol>
          (ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *this,
          ModportSymbol *t)

{
  ModportSymbol *in_stack_00000028;
  ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *in_stack_00000030;
  
  visitDefault<slang::ast::ModportSymbol>(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }